

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O2

float32 helper_rsqrte_f32_aarch64(float32 input,void *fpstp)

{
  undefined4 in_EAX;
  float32 fVar1;
  int iVar2;
  float32 fVar3;
  uint64_t uVar4;
  uint uVar5;
  undefined4 uStack_18;
  int f32_exp;
  
  uStack_18 = in_EAX;
  fVar1 = float32_squash_input_denormal_aarch64(input,(float_status *)fpstp);
  _uStack_18 = CONCAT44(fVar1 >> 0x17,uStack_18) & 0xffffffffff;
  uVar5 = fVar1 & 0x7fffffff;
  if (uVar5 < 0x7f800001) {
    if (uVar5 == 0) {
      float_raise_aarch64('\x04',(float_status *)fpstp);
      fVar3 = fVar1 | 0x7f800000;
    }
    else {
      if ((int)fVar1 < 0) {
        float_raise_aarch64('\x01',(float_status *)fpstp);
        goto LAB_0061d36b;
      }
      fVar3 = 0;
      if (uVar5 != 0x7f800000) {
        uVar4 = recip_sqrt_estimate(&f32_exp,0x17c,(ulong)(fVar1 & 0x7fffff) << 0x1d);
        fVar3 = (uint)(uVar4 >> 0x1d) & 0x7f8000 | (f32_exp & 0xffU) << 0x17;
      }
    }
  }
  else {
    iVar2 = float32_is_signaling_nan_aarch64(fVar1,(float_status *)fpstp);
    if (iVar2 != 0) {
      float_raise_aarch64('\x01',(float_status *)fpstp);
      fVar1 = float32_silence_nan_aarch64(fVar1,(float_status *)fpstp);
    }
    fVar3 = fVar1;
    if (*(char *)((long)fpstp + 6) != '\0') {
LAB_0061d36b:
      fVar1 = float32_default_nan_aarch64((float_status *)fpstp);
      return fVar1;
    }
  }
  return fVar3;
}

Assistant:

float32 HELPER(rsqrte_f32)(float32 input, void *fpstp)
{
    float_status *s = fpstp;
    float32 f32 = float32_squash_input_denormal(input, s);
    uint32_t val = float32_val(f32);
    uint32_t f32_sign = float32_is_neg(f32);
    int f32_exp = extract32(val, 23, 8);
    uint32_t f32_frac = extract32(val, 0, 23);
    uint64_t f64_frac;

    if (float32_is_any_nan(f32)) {
        float32 nan = f32;
        if (float32_is_signaling_nan(f32, s)) {
            float_raise(float_flag_invalid, s);
            nan = float32_silence_nan(f32, s);
        }
        if (s->default_nan_mode) {
            nan =  float32_default_nan(s);
        }
        return nan;
    } else if (float32_is_zero(f32)) {
        float_raise(float_flag_divbyzero, s);
        return float32_set_sign(float32_infinity, float32_is_neg(f32));
    } else if (float32_is_neg(f32)) {
        float_raise(float_flag_invalid, s);
        return float32_default_nan(s);
    } else if (float32_is_infinity(f32)) {
        return float32_zero;
    }

    /* Scale and normalize to a double-precision value between 0.25 and 1.0,
     * preserving the parity of the exponent.  */

    f64_frac = ((uint64_t) f32_frac) << 29;

    f64_frac = recip_sqrt_estimate(&f32_exp, 380, f64_frac);

    /* result = sign : result_exp<4:0> : estimate<7:0> : Zeros(15) */
    val = deposit32(0, 31, 1, f32_sign);
    val = deposit32(val, 23, 8, f32_exp);
    val = deposit32(val, 15, 8, extract64(f64_frac, 52 - 8, 8));
    return make_float32(val);
}